

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O3

int D_PickRandomTeam(void)

{
  FTeam *pFVar1;
  undefined8 *puVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  undefined8 *puVar6;
  ulong uVar7;
  FTeam *pFVar8;
  long lVar9;
  int iVar10;
  int *piVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int i;
  
  pFVar8 = Teams.Array;
  uVar7 = (ulong)Teams.Count;
  if (uVar7 != 0) {
    lVar9 = 0;
    do {
      *(undefined8 *)((long)&pFVar8->m_iPresent + lVar9) = 0;
      lVar9 = lVar9 + 0x38;
    } while (uVar7 * 0x38 - lVar9 != 0);
  }
  lVar9 = 0;
  iVar14 = 0;
  do {
    if (playeringame[lVar9] == true) {
      puVar2 = (undefined8 *)
               ((ulong)(((&DAT_017e1e88)[lVar9 * 0xa8] - 1 & 0x203) * 0x18) +
               (&DAT_017e1e78)[lVar9 * 0x54]);
      do {
        puVar6 = puVar2;
        puVar2 = (undefined8 *)*puVar6;
      } while (*(int *)(puVar6 + 1) != 0x203);
      uVar5 = *(uint *)(puVar6[2] + 0x28);
      bVar4 = FTeam::IsValidTeam(&TeamLibrary,uVar5);
      if (bVar4) {
        iVar10 = Teams.Array[(int)uVar5].m_iPresent;
        Teams.Array[(int)uVar5].m_iPresent = iVar10 + 1;
        iVar14 = iVar14 + (uint)(iVar10 == 0);
      }
    }
    pFVar8 = Teams.Array;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  if (iVar14 < 2) {
    do {
      uVar5 = FRandom::GenRand32(&pr_pickteam);
      uVar7 = (ulong)(uVar5 & 0xff) % (ulong)Teams.Count;
      iVar14 = (int)uVar7;
    } while (Teams.Array[uVar7].m_iPresent != 0);
  }
  else {
    uVar7 = (ulong)Teams.Count;
    if (uVar7 != 0) {
      piVar11 = &(Teams.Array)->m_iPresent;
      iVar14 = 0x7fffffff;
      uVar12 = 0;
      iVar10 = 0;
      do {
        iVar13 = *piVar11;
        if (0 < iVar13) {
          pFVar1 = pFVar8;
          iVar3 = 0;
          if (iVar14 <= iVar13) {
            if (iVar13 != iVar14) goto LAB_00372744;
            pFVar1 = pFVar8 + (iVar10 + 1);
            iVar13 = iVar14;
            iVar3 = iVar10 + 1;
          }
          iVar10 = iVar3;
          pFVar1->m_iTies = (int)uVar12;
          iVar14 = iVar13;
        }
LAB_00372744:
        uVar12 = uVar12 + 1;
        piVar11 = piVar11 + 0xe;
      } while (uVar7 != uVar12);
      pFVar8 = Teams.Array;
      if (iVar10 != 0) {
        uVar5 = FRandom::GenRand32(&pr_pickteam);
        pFVar8 = Teams.Array + ((long)(ulong)(uVar5 & 0xff) % (long)(iVar10 + 1) & 0xffffffff);
      }
    }
    iVar14 = pFVar8->m_iTies;
  }
  return iVar14;
}

Assistant:

int D_PickRandomTeam ()
{
	for (unsigned int i = 0; i < Teams.Size (); i++)
	{
		Teams[i].m_iPresent = 0;
		Teams[i].m_iTies = 0;
	}

	int numTeams = 0;
	int team;

	for (int i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i])
		{
			team = players[i].userinfo.GetTeam();
			if (TeamLibrary.IsValidTeam(team))
			{
				if (Teams[team].m_iPresent++ == 0)
				{
					numTeams++;
				}
			}
		}
	}

	if (numTeams < 2)
	{
		do
		{
			team = pr_pickteam() % Teams.Size();
		} while (Teams[team].m_iPresent != 0);
	}
	else
	{
		int lowest = INT_MAX, lowestTie = 0;
		unsigned int i;

		for (i = 0; i < Teams.Size (); ++i)
		{
			if (Teams[i].m_iPresent > 0)
			{
				if (Teams[i].m_iPresent < lowest)
				{
					lowest = Teams[i].m_iPresent;
					lowestTie = 0;
					Teams[0].m_iTies = i;
				}
				else if (Teams[i].m_iPresent == lowest)
				{
					Teams[++lowestTie].m_iTies = i;
				}
			}
		}
		if (lowestTie == 0)
		{
			team = Teams[0].m_iTies;
		}
		else
		{
			team = Teams[pr_pickteam() % (lowestTie+1)].m_iTies;
		}
	}

	return team;
}